

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentType.cpp
# Opt level: O1

void __thiscall DIS::EnvironmentType::unmarshal(EnvironmentType *this,DataStream *dataStream)

{
  DataStream::operator>>(dataStream,&this->_entityKind);
  DataStream::operator>>(dataStream,&this->_domain);
  DataStream::operator>>(dataStream,&this->_entityClass);
  DataStream::operator>>(dataStream,&this->_category);
  DataStream::operator>>(dataStream,&this->_subcategory);
  DataStream::operator>>(dataStream,&this->_specific);
  DataStream::operator>>(dataStream,&this->_extra);
  return;
}

Assistant:

void EnvironmentType::unmarshal(DataStream& dataStream)
{
    dataStream >> _entityKind;
    dataStream >> _domain;
    dataStream >> _entityClass;
    dataStream >> _category;
    dataStream >> _subcategory;
    dataStream >> _specific;
    dataStream >> _extra;
}